

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O3

int dwarf_get_loclist_lle
              (Dwarf_Debug dbg,Dwarf_Unsigned contextnumber,Dwarf_Unsigned entry_offset,
              Dwarf_Unsigned endoffset,uint *entrylen,uint *entry_kind,
              Dwarf_Unsigned *entry_operand1,Dwarf_Unsigned *entry_operand2,
              Dwarf_Unsigned *expr_ops_blocksize,Dwarf_Unsigned *expr_ops_offset,
              Dwarf_Small **expr_opsdata,Dwarf_Error *error)

{
  Dwarf_Loclists_Context pDVar1;
  Dwarf_Small *pDVar2;
  int iVar3;
  char *msg;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_loclist_lle()either null or it containsa stale Dwarf_Debug pointer"
    ;
    dbg = (Dwarf_Debug)0x0;
  }
  else {
    if (dbg->de_loclists_context_count == 0) {
      return -1;
    }
    if (dbg->de_loclists_context_count <= contextnumber) {
      return -1;
    }
    pDVar1 = dbg->de_loclists_context[contextnumber];
    if ((pDVar1 != (Dwarf_Loclists_Context)0x0) && (pDVar1->lc_magic == 0xadab4)) {
      pDVar2 = (dbg->de_debug_loclists).dss_data;
      iVar3 = read_single_lle_entry
                        (dbg,pDVar2 + entry_offset,entry_offset,pDVar2 + endoffset,
                         (ushort)pDVar1->lc_address_size,entrylen,entry_kind,entry_operand1,
                         entry_operand2,expr_ops_blocksize,expr_ops_offset,expr_opsdata,error);
      return iVar3;
    }
    msg = "DW_DLE_DBG_NULLcontext NULL or not LOCLISTS_MAGIC found in dwarf_get_loclist_lle()";
  }
  _dwarf_error_string(dbg,error,0x51,msg);
  return 1;
}

Assistant:

int dwarf_get_loclist_lle(Dwarf_Debug dbg,
    Dwarf_Unsigned contextnumber,
    Dwarf_Unsigned entry_offset,
    Dwarf_Unsigned endoffset,
    unsigned *entrylen,
    unsigned *entry_kind,
    Dwarf_Unsigned *entry_operand1,
    Dwarf_Unsigned *entry_operand2,
    Dwarf_Unsigned *expr_ops_blocksize,
    Dwarf_Unsigned *expr_ops_offset,
    Dwarf_Small   **expr_opsdata,
    Dwarf_Error *error)
{
    Dwarf_Loclists_Context con = 0;
    Dwarf_Small *data = 0;
    Dwarf_Small *enddata = 0;
    int res = 0;
    Dwarf_Half address_size = 0;

    CHECK_DBG(dbg,error,"dwarf_get_loclist_lle()");
    if (!dbg->de_loclists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    data = dbg->de_debug_loclists.dss_data +
        entry_offset;
    enddata = dbg->de_debug_loclists.dss_data +
        endoffset;
    if (contextnumber >= dbg->de_loclists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    con = dbg->de_loclists_context[contextnumber];
    if (!con || con->lc_magic != LOCLISTS_MAGIC) {
        _dwarf_error_string(dbg, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL"
            "context NULL or not LOCLISTS_MAGIC "
            "found in "
            "dwarf_get_loclist_lle()");
        return DW_DLV_ERROR;
    }
    address_size = con->lc_address_size;
    res = read_single_lle_entry(dbg,
        data,entry_offset,enddata,
        address_size, entrylen,
        entry_kind, entry_operand1, entry_operand2,
        expr_ops_blocksize,
        expr_ops_offset,
        expr_opsdata,
        error);
    return res;
}